

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

usize __thiscall String::split(String *this,List<String> *tokens,char *separators,bool skipEmpty)

{
  usize *puVar1;
  char *__s;
  char *pcVar2;
  char *__s_00;
  String local_60;
  String *local_38;
  
  List<String>::clear(tokens);
  local_38 = this;
  __s = operator_cast_to_char_(this);
  pcVar2 = strpbrk(__s,separators);
  __s_00 = __s;
  if (pcVar2 != (char *)0x0) {
    do {
      if ((long)pcVar2 - (long)__s_00 == 0) {
        if (!skipEmpty) {
          local_60.data = &emptyData.super_Data;
          List<String>::insert(tokens,&tokens->_end,&local_60);
          if ((local_60.data)->ref != 0) {
            LOCK();
            puVar1 = &(local_60.data)->ref;
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && (local_60.data != (Data *)0x0)) {
              operator_delete__(local_60.data);
            }
          }
        }
      }
      else {
        substr(&local_60,local_38,(long)__s_00 - (long)__s,(long)pcVar2 - (long)__s_00);
        List<String>::insert(tokens,&tokens->_end,&local_60);
        __s_00 = pcVar2;
        if ((local_60.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_60.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_60.data != (Data *)0x0)) {
            operator_delete__(local_60.data);
          }
        }
      }
      __s_00 = __s_00 + 1;
      pcVar2 = strpbrk(__s_00,separators);
    } while (pcVar2 != (char *)0x0);
  }
  if (__s_00 < __s + local_38->data->len) {
    substr(&local_60,local_38,(long)__s_00 - (long)__s,-1);
    List<String>::insert(tokens,&tokens->_end,&local_60);
  }
  else {
    if (skipEmpty) goto LAB_001086a4;
    local_60.data = &emptyData.super_Data;
    List<String>::insert(tokens,&tokens->_end,&local_60);
  }
  if ((local_60.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_60.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_60.data != (Data *)0x0)) {
      operator_delete__(local_60.data);
    }
  }
LAB_001086a4:
  return tokens->_size;
}

Assistant:

usize String::split(List<String>& tokens, const char* separators, bool skipEmpty) const
{
  tokens.clear();

  const char* start = *this;
  const char* p = start, * endStr;
  for(;;)
  {
    endStr = strpbrk(p, separators);
    if(endStr)
    {
      usize len = endStr - p;
      if(len)
      {
        tokens.append(substr(p - start, len));
        p = endStr + 1;
      }
      else
      {
        if(!skipEmpty)
          tokens.append(String());
        ++p;
      }
    }
    else
    {
      if(p < start + data->len)
        tokens.append(substr(p - start));
      else if(!skipEmpty)
        tokens.append(String());
      break;
    }
  }
  return tokens.size();
}